

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int __thiscall Player::reinforce(Player *this)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  PlayerStrategy *pPVar7;
  ostream *poVar8;
  void *this_00;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  reference ppCVar9;
  ulong uVar10;
  __type local_e9;
  string local_a0;
  Country *local_80;
  Country *country;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  int place;
  int troops;
  int newArmies;
  int exchange;
  string local_40;
  anon_class_1_0_00000001 local_1b;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  anon_class_1_0_00000001 continentControlValue;
  anon_class_1_0_00000001 countriesOwned;
  Player *pPStack_18;
  anon_class_1_0_00000001 cardExchange;
  Player *this_local;
  
  pPStack_18 = this;
  setPlayerState(this,REINFORCING);
  notifyAll(this);
  pPVar7 = getStrategy(this);
  PlayerStrategy::getStrategyName_abi_cxx11_(&local_40,pPVar7);
  bVar1 = std::operator==(&local_40,"CHEATER");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    pPVar7 = getStrategy(this);
    iVar4 = (**pPVar7->_vptr_PlayerStrategy)(pPVar7,10);
    this_local._4_4_ = (int)(char)iVar4;
  }
  else {
    iVar4 = reinforce::anon_class_1_0_00000001::operator()(&local_19,this);
    if (iVar4 < 0) {
      setPlayerState(this,IDLE);
      (*this->strategy->_vptr_PlayerStrategy[5])();
      this_local._4_4_ = -1;
    }
    else {
      iVar5 = reinforce::anon_class_1_0_00000001::operator()(&local_1a,this);
      iVar6 = reinforce::anon_class_1_0_00000001::operator()(&local_1b,this);
      place = iVar4 + iVar5 + iVar6;
      (*this->strategy->_vptr_PlayerStrategy[2])(this->strategy,(ulong)(uint)place);
      poVar8 = std::operator<<((ostream *)&std::cout,"Place your armies:");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
LAB_0010eb27:
      if (0 < place) {
        poVar8 = std::operator<<((ostream *)&std::cout,"Troops remaining: ");
        this_00 = (void *)std::ostream::operator<<(poVar8,place);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        this_01 = getOwnedCountries(this);
        __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(this_01);
        country = (Country *)
                  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                           *)&country), bVar1) {
          ppCVar9 = __gnu_cxx::
                    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                    ::operator*(&__end2);
          local_80 = *ppCVar9;
          Map::Country::getCountryName_abi_cxx11_(&local_a0,local_80);
          poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_a0);
          poVar8 = std::operator<<(poVar8," has ");
          iVar4 = Map::Country::getNumberOfTroops(local_80);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
          std::operator<<(poVar8," armies. Add how many? ");
          std::__cxx11::string::~string((string *)&local_a0);
          do {
            (*this->strategy->_vptr_PlayerStrategy[4])(this->strategy,local_80);
            (*this->strategy->_vptr_PlayerStrategy[2])(this->strategy,(ulong)(uint)place);
            iVar4 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,0xc);
            uVar10 = std::ios::fail();
            if (((((uVar10 & 1) != 0) || (place < iVar4)) || (iVar4 < 0)) ||
               (_Var2 = std::isnan<int>(iVar4), _Var2)) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "Invalid value entered. Pleased try again.");
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            }
            bVar3 = std::ios::fail();
            local_e9 = true;
            if ((((bVar3 & 1) == 0) && (local_e9 = true, iVar4 <= place)) &&
               (local_e9 = true, -1 < iVar4)) {
              local_e9 = std::isnan<int>(iVar4);
            }
          } while (local_e9 != false);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          iVar5 = Map::Country::getNumberOfTroops(local_80);
          Map::Country::setNumberOfTroops(local_80,iVar5 + iVar4);
          place = place - iVar4;
          if (place < 1) {
            poVar8 = std::operator<<((ostream *)&std::cout,"\nYou\'ve placed all your armies!");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            break;
          }
          __gnu_cxx::
          __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
          ::operator++(&__end2);
        }
        goto LAB_0010eb27;
      }
      setPlayerState(this,IDLE);
      (*this->strategy->_vptr_PlayerStrategy[5])();
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Player::reinforce() {
    /* Act of collecting new armies and placing them on the map
     * 0. At the start of your turn, if you have 5+ cards, player must trade at least 1 set.
     * 1. Trade valid sets of cards to receive armies
     * 2. Place received armies on the map
     */
    auto cardExchange = [](Player &player) {
        auto output = 0;

        while (true) {
            if (player.getCards()->getHand()->size() > 5) {
                std::cout << "You have more than 5 cards in your hand, so you must exchange at least once" << std::endl;
            } else if (canExchange(*player.getCards()->getHand())) {
                char input = 0;
                do {
                    std::cout << "Would you like to exchange cards? (Y/n)";
                    input = player.strategy->yesOrNo(StrategyContext::REINFORCE);
                    if (input != 'y' && input != 'n' && input != 'Y' && input != 'N') {
                        std::cout << "\nInvalid Input. Please try again." << std::endl;
                    }
                } while (input != 'y' && input != 'n' && input != 'Y' && input != 'N');
                if (input == 'n' || input == 'N') {
                    return output;
                }
            } else {
                std::cout << "You don't have valid cards to exchange! Moving on..." << std::endl;
                return output;
            }
            std::cout << "What cards would you like to exchange?" << std::endl;
            int types[3] = {};
            types[0] = 0, types[1] = 0, types[2] = 0;
            for (auto card : *player.getCards()->getHand()) {
                switch (card) {
                    case CardType::INFANTRY:
                        types[0]++;
                        break;
                    case CardType::ARTILLERY:
                        types[1]++;
                        break;
                    case CardType::CAVALRY:
                        types[2]++;
                        break;
                    default: {
                        return -1;
                    }
                }
            }

            std::cout << "You hand is: " << std::endl;
            std::cout << types[0] << " infantry, ";
            std::cout << types[1] << " artillery, and ";
            std::cout << types[2] << " cavalry" << std::endl;

            auto cardsToExchange = std::vector<CardType>();
            auto remaining = 3;

            while (remaining > 0) {
                std::cout << "You must pick " << remaining << " more cards to exchange" << std::endl;
                for (auto i = 0; i <= 2; i++) {
                    if (types[i] > 0) {
                        auto input = 0;
                        int failsafeCounter = 0;
                        do {
                            //avoid infinite loops in case of bot malfunction or human delaying the game
                            if(failsafeCounter >= 10){
                                std::cout << "An error occurred while exchanging your cards." << std::endl;
                                return -1;
                            }
                            failsafeCounter++;
                            std::cout << "How many " << (i == 0 ? "infantry" : i == 1 ? "artillery" : "cavalry");
                            std::cout << " would you like to exchange?";
                            player.strategy->setExchangingCardType(i);
                            input = player.strategy->intInput(StrategyContext::REINFORCE_CARD_COUNT);
                            if (input > remaining) {
                                std::cout << "You can only exchange " << remaining << " more cards" << std::endl;
                            } else if (input > types[i]) {
                                std::cout
                                        << "You cannot exchange more cards of a given type than you have in your hand.";
                            } else {
                                for (auto j = 0; j < input; j++, remaining--) {
                                    cardsToExchange.push_back((CardType) i);
                                }

                            }
                        } while ((input > types[i] || input > remaining) && remaining != 0);
                    }
                }
            }
            auto out = Hand::exchange(player.getCards(), GameLoop::getInstance()->getGameDeck(), cardsToExchange);
            if (out == -1) {
                std::cout << "An error occurred while exchanging your cards." << std::endl;
                return -1;
            } else {
                output += out;
            }
        }
    };

    auto countriesOwned = [](Player& player) {
        auto countries = player.getOwnedCountries()->size();

        return countries < 9 ? 3 : (int) countries / 3;
    };

    auto continentControlValue = [](const Player &player) {
        auto value = 0;
        for (auto *cont : *GameLoop::getInstance()->getGameMap()->getMapContinents()) {
            auto fullControl = true;

            for (auto *country : *cont->getCountriesInContinent()) {
                if (player.getPlayerId() != country->getPlayerOwnerID()) {
                    fullControl = false;
                    break;
                }
            }

            if (fullControl) {
                value += cont->getpCTroops();
            }
        }

        return value;
    };

    this->setPlayerState(PlayerState::REINFORCING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::REINFORCE);
    }

    auto exchange = cardExchange(*this);
    if (exchange < 0) {
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::FAILED;
    }

    auto newArmies = exchange + countriesOwned(*this) + continentControlValue(*this);
    strategy->setArmiesToPlace(newArmies);

    std::cout << "Place your armies:" << std::endl;

    int troops, place = 0;
    while (newArmies > 0) {
        std::cout << "Troops remaining: " << newArmies << std::endl;
        for (auto *country : *this->getOwnedCountries()) {
            std::cout << country->getCountryName() << " has " << country->getNumberOfTroops() << " armies. Add how many? ";
            do {
                strategy->setTo(country);
                strategy->setArmiesToPlace(newArmies);
                place = strategy->intInput(StrategyContext::REINFORCE_ARMY_COUNT);
                if(cin.fail() || place > newArmies || place < 0 || isnan(place)) {
                    std::cout << "Invalid value entered. Pleased try again." << std::endl;
                }
            } while (cin.fail() || place > newArmies || place < 0 || isnan(place));
            std::cout << std::endl;
            troops = country->getNumberOfTroops();
            country->setNumberOfTroops(troops + place);
            newArmies -= place;
            if (newArmies <= 0) {
                std::cout << "\nYou've placed all your armies!" << std::endl;
                break;
            }
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}